

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStructSet(InternalAnalyzer *this,StructSet *curr)

{
  bool bVar1;
  StructSet *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = Type::isNull((Type *)(*(long *)(curr + 0x18) + 8));
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    this->parent->writesStruct = true;
    bVar1 = Type::isNullable((Type *)(*(long *)(curr + 0x18) + 8));
    if (bVar1) {
      this->parent->implicitTrap = true;
    }
    if (*(int *)(curr + 0x28) != 0) {
      this->parent->isAtomic = true;
    }
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.writesStruct = true;
      // traps when the arg is null
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
      if (curr->order != MemoryOrder::Unordered) {
        parent.isAtomic = true;
      }
    }